

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

bool __thiscall
dg::llvmdg::LazyLLVMCallGraph::calls(LazyLLVMCallGraph *this,Function *F,Function *what)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  _Var4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  _Base_ptr p_Var7;
  
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  p_Var7 = p_Var3;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      p_Var2 = p_Var7 + 1;
      if (*(Function **)p_Var2 >= F) {
        p_Var5 = p_Var7;
      }
      pp_Var6 = &p_Var7->_M_left;
      p_Var7 = pp_Var6[*(Function **)p_Var2 < F];
    } while (pp_Var6[*(Function **)p_Var2 < F] != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(Function **)(p_Var5 + 1) <= F))
    goto LAB_001214d4;
  }
  _populateCalledFunctions(this,F);
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
LAB_001214d4:
  p_Var5 = p_Var3;
  p_Var7 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      p_Var2 = p_Var5 + 1;
      if (*(Function **)p_Var2 >= F) {
        p_Var7 = p_Var5;
      }
      pp_Var6 = &p_Var5->_M_left;
      p_Var5 = pp_Var6[*(Function **)p_Var2 < F];
    } while (pp_Var6[*(Function **)p_Var2 < F] != (_Base_ptr)0x0);
    p_Var5 = &p_Var1->_M_header;
    pp_Var6 = (_Base_ptr *)0x0;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(Function **)(p_Var7 + 1) <= F)) {
      pp_Var6 = &p_Var7[1]._M_parent;
    }
    do {
      if (*(Function **)(p_Var3 + 1) >= what) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(Function **)(p_Var3 + 1) < what];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      if (pp_Var6 == (_Base_ptr *)0x0) {
        return false;
      }
      if (what < *(Function **)(p_Var5 + 1)) {
        return false;
      }
      p_Var3 = pp_Var6[2];
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::GenericCallGraph<llvm::Function_const*>::FuncNode::_contains<std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>(dg::GenericCallGraph<llvm::Function_const*>::FuncNode_const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>const&)const::_lambda(dg::GenericCallGraph<llvm::Function_const*>::FuncNode*)_1_>>
                        (pp_Var6[1],p_Var3,&p_Var5[1]._M_parent);
      return (_Base_ptr)_Var4._M_current != p_Var3;
    }
  }
  return false;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fn1 = _cg.get(F);
        auto fn2 = _cg.get(what);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }